

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandLineArgument.h
# Opt level: O2

string * __thiscall
cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*,_cmMakefile_*)>
::extract_single_value
          (string *__return_storage_ptr__,
          cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*,_cmMakefile_*)>
          *this,string *input,ParseMode *parseState)

{
  size_t sVar1;
  basic_string_view<char,_std::char_traits<char>_> possible_value;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = (input->_M_dataplus)._M_p;
  local_20._M_len = input->_M_string_length;
  possible_value =
       std::basic_string_view<char,_std::char_traits<char>_>::substr
                 (&local_20,(this->Name)._M_string_length,0xffffffffffffffff);
  if (possible_value._M_len == 0) {
LAB_00152417:
    *parseState = 3;
  }
  else {
    if (*possible_value._M_str == '=') {
      sVar1 = possible_value._M_len - 1;
      possible_value._M_str = possible_value._M_str + 1;
      possible_value._M_len = sVar1;
      if (sVar1 == 0) goto LAB_00152417;
    }
    sVar1 = possible_value._M_len;
    if ((*parseState == 0) && (*possible_value._M_str == ' ')) {
      possible_value._M_str = possible_value._M_str + 1;
      possible_value._M_len = sVar1 - 1;
    }
  }
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,&possible_value,(allocator<char> *)&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::string extract_single_value(std::string const& input,
                                   ParseMode& parseState) const
  {
    // parse the string to get the value
    auto possible_value = cm::string_view(input).substr(this->Name.size());
    if (possible_value.empty()) {
      parseState = ParseMode::ValueError;
    } else if (possible_value[0] == '=') {
      possible_value.remove_prefix(1);
      if (possible_value.empty()) {
        parseState = ParseMode::ValueError;
      }
    }
    if (parseState == ParseMode::Valid && possible_value[0] == ' ') {
      possible_value.remove_prefix(1);
    }
    return std::string(possible_value);
  }